

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O1

bool __thiscall
cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_insert_update
          (ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,unsigned_long *key
          ,unsigned_long *value,time_point expire_time,allow a)

{
  _Rb_tree_header *p_Var1;
  list<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
  *this_00;
  uint in_EAX;
  _Base_ptr p_Var2;
  _Base_ptr __len;
  _Base_ptr p_Var3;
  
  __len = (this->m_keyed_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_keyed_elements)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  if (__len != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(__len + 1) >= *key) {
        p_Var2 = __len;
      }
      __len = (&__len->_M_left)[*(ulong *)(__len + 1) < *key];
    } while (__len != (_Base_ptr)0x0);
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (__len = (_Base_ptr)*key, p_Var3 = p_Var2, __len < *(_Base_ptr *)(p_Var2 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    if ((a & insert) == 0) {
      return false;
    }
    do_insert(this,key,value,expire_time);
  }
  else {
    if ((a & update) == 0) {
      return false;
    }
    p_Var3[1]._M_parent = (_Base_ptr)*value;
    p_Var2 = p_Var3[1]._M_left;
    p_Var2->_M_left = (_Base_ptr)expire_time.__d.__r;
    this_00 = &this->m_ttl_list;
    std::__cxx11::
    list<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
    ::splice(this_00,(int)this_00,(__off64_t *)this_00,(int)p_Var2,(__off64_t *)a,(size_t)__len,
             in_EAX);
    p_Var3[1]._M_left =
         (_Base_ptr)
         (this->m_ttl_list).
         super__List_base<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
  }
  return true;
}

Assistant:

auto do_insert_update(
        const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time, allow a) -> bool
    {
        const auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value), expire_time);
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value), expire_time);
                return true;
            }
        }
        return false;
    }